

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
::append(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
         *this,unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
               *item)

{
  element_type *peVar1;
  type pKVar2;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  *this_00;
  size_t __n;
  void *__buf;
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  *in_RDI;
  OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void> writer;
  path *in_stack_ffffffffffffff50;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  *in_stack_ffffffffffffff58;
  string_type *__source;
  path *in_stack_ffffffffffffff80;
  FileManager *in_stack_ffffffffffffff88;
  string_type local_70 [2];
  OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void> local_18 [3];
  format fVar3;
  
  getFileManager(in_stack_ffffffffffffff58);
  peVar1 = std::
           __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19b470);
  fVar3 = (format)((ulong)peVar1 >> 0x38);
  __source = local_70;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>
  ::getStorageFilePath_abi_cxx11_(in_stack_ffffffffffffff58);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff80,__source,fVar3);
  __n = 1;
  io::FileManager::getOutputIterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,SUB81((ulong)__source >> 0x38,0));
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)local_70);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x19b4de);
  pKVar2 = std::
           unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
           ::operator*((unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                        *)in_stack_ffffffffffffff50);
  io::OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>::write
            (local_18,(int)pKVar2,__buf,__n);
  io::OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>::flush
            ((OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void> *)0x19b513
            );
  this_00 = OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
            ::getRegister(in_RDI);
  pKVar2 = std::
           unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
           ::operator*((unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                        *)this_00);
  (*(this_00->
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>
    ).
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
    ._vptr_Cloneable[3])(this_00,pKVar2);
  io::OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>::~OutputIterator
            ((OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void> *)0x19b55a
            );
  return;
}

Assistant:

void append(std::unique_ptr<T> &&item) override {
        io::OutputIterator<T> writer = getFileManager()->template getOutputIterator<T>(getStorageFilePath(), true);
        writer.write(*item);
        writer.flush();
        getRegister().registerItem(*item);
    }